

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

Scal __thiscall LinearExpert<1,_1>::queryXafterZ(LinearExpert<1,_1> *this,X *x)

{
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_RDI;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  ReturnType RVar1;
  double dVar2;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_01;
  Scalar __x;
  X xInvVar;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_ffffffffffffff90;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_ffffffffffffffb0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffd0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_ffffffffffffffd8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_ffffffffffffff90,in_RDI);
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(*(double *)(in_RDI + 0xf0) + 1.0);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_ffffffffffffff90,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseAbs2(this_00);
  RVar1 = Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>>
          ::dot<Eigen::Matrix<double,1,1,0,1,1>>
                    (in_stack_ffffffffffffff90,
                     (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI);
  dVar2 = exp(RVar1 * -0.5);
  *(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xd0) = dVar2;
  *(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xd8) =
       *(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 200) *
       *(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xd0);
  this_01 = (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
            (*(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xb0) *
            *(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xd0));
  __x = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod(this_01);
  dVar2 = sqrt(__x);
  *(double *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xc0) =
       (double)this_01 * dVar2;
  return *(Scal *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0xc0);
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryXafterZ( X const &x )
{
    dx = x - pred_x;

    X xInvVar = invPsi / (1.0 + gamma);

    rbf_x = exp(-0.5*dx.cwiseAbs2().dot(xInvVar));
    rbf_zx = rbf_z * rbf_x;
    p_zx = p_z_T * rbf_x * sqrt(xInvVar.prod());

    return p_zx;
}